

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
adios2sys::CommandLineArguments::AddArgument
          (CommandLineArguments *this,char *argument,ArgumentTypeEnum type,VariableTypeEnum vtype,
          void *variable,char *help)

{
  mapped_type *__dest;
  char *in_RSI;
  CommandLineArgumentsCallbackStructure s;
  CommandLineArguments *in_stack_00000450;
  key_type *in_stack_ffffffffffffff78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
  *in_stack_ffffffffffffff80;
  undefined1 local_60 [16];
  undefined8 local_50;
  undefined8 local_48;
  
  local_50 = 0;
  local_48 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff80,in_RSI,(allocator *)&stack0xffffffffffffff7f);
  __dest = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  memcpy(__dest,local_60,0x38);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  GenerateHelp(in_stack_00000450);
  return;
}

Assistant:

void CommandLineArguments::AddArgument(const char* argument,
                                       ArgumentTypeEnum type,
                                       VariableTypeEnum vtype, void* variable,
                                       const char* help)
{
  CommandLineArgumentsCallbackStructure s;
  s.Argument = argument;
  s.ArgumentType = type;
  s.Callback = nullptr;
  s.CallData = nullptr;
  s.VariableType = vtype;
  s.Variable = variable;
  s.Help = help;

  this->Internals->Callbacks[argument] = s;
  this->GenerateHelp();
}